

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O0

Ray * __thiscall pbrt::Transform::ApplyInverse(Transform *this,Ray *r,Float *tMax)

{
  float *in_RCX;
  long in_RDX;
  Ray *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  Vector3<float> VVar5;
  Transform *unaff_retaddr;
  Float dt;
  Vector3f oError;
  Float lengthSquared;
  Vector3f d;
  Point3fi o;
  Point3fi *in_stack_00000368;
  Transform *in_stack_00000370;
  float in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffeec;
  float in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  Point3<pbrt::Interval<float>_> *in_stack_fffffffffffffef8;
  Float time;
  Tuple3<pbrt::Vector3,_float> *in_stack_ffffffffffffff00;
  Ray *this_00;
  Tuple3<pbrt::Vector3,_float> local_90;
  float local_84;
  Point3<pbrt::Interval<float>_> local_80;
  float local_68;
  Tuple3<pbrt::Vector3,_float> local_5c [3];
  Interval<float> local_38;
  Interval<float> local_30;
  Interval<float> local_28;
  float *local_20;
  long local_18;
  Ray *v;
  undefined1 auVar4 [56];
  
  auVar4 = in_ZMM0._8_56_;
  this_00 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  v = in_RDI;
  Point3fi::Point3fi((Point3fi *)in_RDI,&in_RDI->o);
  ApplyInverse(in_stack_00000370,in_stack_00000368);
  VVar5 = ApplyInverse<float>(unaff_retaddr,(Vector3<float> *)v);
  local_68 = VVar5.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar1._0_8_ = VVar5.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar1._8_56_ = auVar4;
  local_80.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
       (Interval<float>)vmovlpd_avx(auVar1._0_16_);
  local_5c[0]._0_8_ = local_80.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
  local_5c[0].z = local_68;
  local_80.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high =
       LengthSquared<float>((Vector3<float> *)local_5c);
  if (0.0 < local_80.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high) {
    in_stack_fffffffffffffef4 = Interval<float>::Width(&local_38);
    in_stack_fffffffffffffeec = 0.5;
    in_stack_fffffffffffffef4 = in_stack_fffffffffffffef4 * 0.5;
    in_stack_fffffffffffffef0 = Interval<float>::Width(&local_30);
    in_stack_fffffffffffffef0 = in_stack_fffffffffffffef0 * in_stack_fffffffffffffeec;
    Interval<float>::Width(&local_28);
    auVar4 = (undefined1  [56])0x0;
    in_stack_fffffffffffffef8 = &local_80;
    Vector3<float>::Vector3
              ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,0.0);
    in_stack_ffffffffffffff00 = local_5c;
    VVar5 = Abs<pbrt::Vector3,float>(in_stack_ffffffffffffff00);
    local_90.z = VVar5.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar2._0_8_ = VVar5.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar2._8_56_ = auVar4;
    local_90._0_8_ = vmovlpd_avx(auVar2._0_16_);
    local_84 = Dot<float>((Vector3<float> *)&local_90,(Vector3<float> *)in_stack_fffffffffffffef8);
    local_84 = local_84 / local_80.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
    auVar4 = (undefined1  [56])0x0;
    VVar5 = Tuple3<pbrt::Vector3,float>::operator*
                      (in_stack_ffffffffffffff00,(float)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    auVar3._0_8_ = VVar5.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar3._8_56_ = auVar4;
    vmovlpd_avx(auVar3._0_16_);
    Point3fi::operator+=
              ((Point3fi *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (Vector3<float> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    if (local_20 != (float *)0x0) {
      *local_20 = *local_20 - local_84;
    }
  }
  Point3<float>::Point3<pbrt::Interval<float>>
            ((Point3<float> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  time = (Float)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  MediumHandle::MediumHandle
            ((MediumHandle *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (MediumHandle *)CONCAT44(in_stack_fffffffffffffeec,*(undefined4 *)(local_18 + 0x18)));
  Ray::Ray(this_00,&in_RDI->o,(Vector3f *)in_stack_ffffffffffffff00,time,
           (MediumHandle *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  return this_00;
}

Assistant:

inline Ray Transform::ApplyInverse(const Ray &r, Float *tMax) const {
    Point3fi o = ApplyInverse(Point3fi(r.o));
    Vector3f d = ApplyInverse(r.d);
    // Offset ray origin to edge of error bounds and compute _tMax_
    Float lengthSquared = LengthSquared(d);
    if (lengthSquared > 0) {
        Vector3f oError(o.x.Width() / 2, o.y.Width() / 2, o.z.Width() / 2);
        Float dt = Dot(Abs(d), oError) / lengthSquared;
        o += d * dt;
        if (tMax)
            *tMax -= dt;
    }
    return Ray(Point3f(o), d, r.time, r.medium);
}